

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.h
# Opt level: O1

void __thiscall
Assimp::RAWImporter::GroupInformation::GroupInformation(GroupInformation *this,string *_name)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  (this->meshes).
  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshes).
  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshes).
  super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  ::reserve(&this->meshes,10);
  return;
}

Assistant:

explicit GroupInformation(const std::string& _name)
            : name(_name)
        {
            meshes.reserve(10);
        }